

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<capnproto_test::capnp::test::TestInterface::Client>::fork
          (Promise<capnproto_test::capnp::test::TestInterface::Client> *this)

{
  Own<kj::_::PromiseNode> *in_RSI;
  Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>_> local_28;
  
  refcounted<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_28,in_RSI);
  (this->super_PromiseBase).node.disposer = local_28.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)local_28.ptr;
  local_28.ptr = (ForkHub<capnproto_test::capnp::test::TestInterface::Client> *)0x0;
  Own<kj::_::ForkHub<capnproto_test::capnp::test::TestInterface::Client>_>::dispose(&local_28);
  return (__pid_t)this;
}

Assistant:

ForkedPromise<T> Promise<T>::fork() {
  return ForkedPromise<T>(false, refcounted<_::ForkHub<_::FixVoid<T>>>(kj::mv(node)));
}